

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O3

void start_watcher(uv_loop_t *loop,int signum,signal_ctx *ctx,int one_shot)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uv_loop_t *puVar5;
  long lVar6;
  long *plVar7;
  ulong *puVar8;
  uv_signal_t *puVar9;
  timer_ctx *ptVar10;
  int64_t eval_b;
  int64_t eval_a;
  ulong uStack_7e0;
  timer_ctx tStack_7d8;
  signal_ctx sStack_750;
  signal_ctx sStack_6c8;
  signal_ctx sStack_640;
  signal_ctx sStack_5b8;
  uv_loop_t *puStack_528;
  ulong uStack_4d8;
  ulong uStack_4d0;
  timer_ctx tStack_4c8;
  signal_ctx sStack_440;
  uv_loop_t *puStack_3b8;
  timer_ctx *ptStack_3b0;
  ulong uStack_3a8;
  ulong uStack_3a0;
  signal_ctx sStack_398;
  signal_ctx sStack_310;
  signal_ctx sStack_288;
  signal_ctx sStack_200;
  timer_ctx tStack_178;
  timer_ctx tStack_f0;
  ulong uStack_68;
  uv_signal_t *puStack_60;
  code *pcStack_58;
  long lStack_48;
  code *pcStack_40;
  undefined8 local_30;
  long local_28;
  
  uVar1 = (ulong)(uint)signum;
  ctx->signum = signum;
  ctx->stop_or_close = CLOSE;
  ctx->ncalls = 0;
  ctx->one_shot = one_shot;
  puVar9 = &ctx->handle;
  pcStack_40 = (code *)0x1bd4ad;
  iVar4 = uv_signal_init(loop,puVar9);
  local_28 = (long)iVar4;
  local_30 = 0;
  if (local_28 == 0) {
    lVar6 = 0;
    if (one_shot != 0) {
      pcStack_40 = (code *)0x1bd4da;
      iVar4 = uv_signal_start_oneshot(puVar9,signal_cb_one_shot,uVar1);
      local_28 = (long)iVar4;
      local_30 = 0;
      if (local_28 == 0) {
        return;
      }
      pcStack_40 = (code *)0x1bd505;
      start_watcher_cold_2();
      lVar6 = local_28;
    }
    local_28 = lVar6;
    pcStack_40 = (code *)0x1bd516;
    iVar4 = uv_signal_start(puVar9,signal_cb,uVar1);
    local_28 = (long)iVar4;
    local_30 = 0;
    if (local_28 == 0) {
      return;
    }
  }
  else {
    pcStack_40 = (code *)0x1bd54c;
    start_watcher_cold_1();
  }
  plVar7 = &local_28;
  iVar4 = (int)&local_30;
  pcStack_40 = signal_cb;
  start_watcher_cold_3();
  pcStack_40 = (code *)(long)iVar4;
  lStack_48 = (long)(int)plVar7[0xf];
  if (pcStack_40 == (code *)lStack_48) {
    iVar4 = *(int *)((long)plVar7 + -4) + 1;
    *(int *)((long)plVar7 + -4) = iVar4;
    if (iVar4 != 10) {
      return;
    }
    if ((int)plVar7[-1] == 0) {
      uv_close();
      return;
    }
    if ((int)plVar7[-1] == 1) {
      uv_signal_stop();
      return;
    }
  }
  else {
    pcStack_58 = (code *)0x1bd5bd;
    signal_cb_cold_1();
  }
  pcStack_58 = run_test_we_get_signals;
  signal_cb_cold_2();
  pcStack_58 = (code *)0x0;
  ptStack_3b0 = (timer_ctx *)0x1bd5d3;
  uStack_68 = uVar1;
  puStack_60 = puVar9;
  puVar5 = (uv_loop_t *)uv_default_loop();
  ptStack_3b0 = (timer_ctx *)0x1bd5ed;
  start_watcher(puVar5,10,&sStack_398,0);
  ptStack_3b0 = (timer_ctx *)0x1bd608;
  start_watcher(puVar5,10,&sStack_310,0);
  ptStack_3b0 = (timer_ctx *)0x1bd61f;
  start_watcher(puVar5,0xc,&sStack_288,0);
  ptStack_3b0 = (timer_ctx *)0x1bd636;
  start_watcher(puVar5,0xc,&sStack_200,0);
  ptStack_3b0 = (timer_ctx *)0x1bd64e;
  start_timer(puVar5,10,&tStack_178);
  ptStack_3b0 = (timer_ctx *)0x1bd661;
  start_timer(puVar5,0xc,&tStack_f0);
  ptStack_3b0 = (timer_ctx *)0x1bd66b;
  iVar4 = uv_run(puVar5,0);
  uStack_3a0 = (ulong)iVar4;
  uStack_3a8 = 0;
  if (uStack_3a0 != 0) goto LAB_001bd750;
  lVar6 = 4;
  do {
    uStack_3a0 = (ulong)*(uint *)((long)&sStack_398.stop_or_close + lVar6);
    uStack_3a8 = 10;
    if (uStack_3a0 != 10) {
      ptStack_3b0 = (timer_ctx *)0x1bd743;
      run_test_we_get_signals_cold_2();
      goto LAB_001bd743;
    }
    lVar6 = lVar6 + 0x88;
  } while (lVar6 != 0x224);
  ptVar10 = &tStack_178;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    uStack_3a0 = (ulong)ptVar10->ncalls;
    uStack_3a8 = 10;
    if (uStack_3a0 != 10) goto LAB_001bd743;
    ptVar10 = &tStack_f0;
    bVar2 = false;
  } while (bVar3);
  ptStack_3b0 = (timer_ctx *)0x1bd6f6;
  uv_walk(puVar5,close_walk_cb,0);
  ptStack_3b0 = (timer_ctx *)0x1bd700;
  uv_run(puVar5,0);
  uStack_3a0 = 0;
  ptStack_3b0 = (timer_ctx *)0x1bd711;
  iVar4 = uv_loop_close(puVar5);
  uStack_3a8 = (ulong)iVar4;
  if (uStack_3a0 == uStack_3a8) {
    ptStack_3b0 = (timer_ctx *)0x1bd727;
    uv_library_shutdown();
    return;
  }
LAB_001bd75d:
  ptStack_3b0 = (timer_ctx *)run_test_we_get_signal_one_shot;
  run_test_we_get_signals_cold_4();
  puStack_3b8 = puVar5;
  ptStack_3b0 = &tStack_f0;
  puVar5 = (uv_loop_t *)uv_default_loop();
  start_timer(puVar5,0x11,&tStack_4c8);
  start_watcher(puVar5,0x11,&sStack_440,1);
  sStack_440.stop_or_close = NOOP;
  iVar4 = uv_run(puVar5,0);
  uStack_4d0 = (ulong)iVar4;
  uStack_4d8 = 0;
  if (uStack_4d0 == 0) {
    uStack_4d0 = (ulong)tStack_4c8.ncalls;
    uStack_4d8 = 10;
    if (uStack_4d0 != 10) goto LAB_001bd987;
    uStack_4d0 = 1;
    uStack_4d8 = (ulong)sStack_440.ncalls;
    if (uStack_4d8 != 1) goto LAB_001bd996;
    start_timer(puVar5,0x11,&tStack_4c8);
    iVar4 = uv_run(puVar5,0);
    uStack_4d0 = (ulong)iVar4;
    uStack_4d8 = 0;
    if (uStack_4d0 != 0) goto LAB_001bd9a5;
    uStack_4d0 = 1;
    uStack_4d8 = (ulong)sStack_440.ncalls;
    if (uStack_4d8 != 1) goto LAB_001bd9b4;
    sStack_440.stop_or_close = CLOSE;
    sStack_440.ncalls = 0;
    uv_signal_start_oneshot(&sStack_440.handle,signal_cb_one_shot,0x11);
    start_timer(puVar5,0x11,&tStack_4c8);
    iVar4 = uv_run(puVar5,0);
    uStack_4d0 = (ulong)iVar4;
    uStack_4d8 = 0;
    if (uStack_4d0 != 0) goto LAB_001bd9c3;
    uStack_4d0 = (ulong)tStack_4c8.ncalls;
    uStack_4d8 = 10;
    if (uStack_4d0 != 10) goto LAB_001bd9d2;
    uStack_4d0 = 1;
    uStack_4d8 = (ulong)sStack_440.ncalls;
    if (uStack_4d8 != 1) goto LAB_001bd9e1;
    uv_walk(puVar5,close_walk_cb,0);
    uv_run(puVar5,0);
    uStack_4d0 = 0;
    iVar4 = uv_loop_close(puVar5);
    uStack_4d8 = (ulong)iVar4;
    if (uStack_4d0 == uStack_4d8) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_001bd987:
    run_test_we_get_signal_one_shot_cold_2();
LAB_001bd996:
    run_test_we_get_signal_one_shot_cold_3();
LAB_001bd9a5:
    run_test_we_get_signal_one_shot_cold_4();
LAB_001bd9b4:
    run_test_we_get_signal_one_shot_cold_5();
LAB_001bd9c3:
    run_test_we_get_signal_one_shot_cold_6();
LAB_001bd9d2:
    run_test_we_get_signal_one_shot_cold_7();
LAB_001bd9e1:
    run_test_we_get_signal_one_shot_cold_8();
  }
  puVar8 = &uStack_4d0;
  iVar4 = (int)&uStack_4d8;
  run_test_we_get_signal_one_shot_cold_9();
  if (iVar4 == (int)puVar8[0xf]) {
    iVar4 = *(int *)((long)puVar8 + -4) + 1;
    *(int *)((long)puVar8 + -4) = iVar4;
    if (iVar4 == 1) {
      if ((int)puVar8[-1] != 0) {
        return;
      }
      uv_close();
      return;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_528 = puVar5;
  puVar5 = (uv_loop_t *)uv_default_loop();
  start_timer(puVar5,0x11,&tStack_7d8);
  start_watcher(puVar5,0x11,&sStack_750,1);
  start_watcher(puVar5,0x11,&sStack_6c8,1);
  sStack_750.stop_or_close = CLOSE;
  sStack_6c8.stop_or_close = CLOSE;
  iVar4 = uv_run(puVar5,0);
  uStack_7e0 = (ulong)iVar4;
  if (uStack_7e0 == 0) {
    uStack_7e0 = (ulong)tStack_7d8.ncalls;
    if (uStack_7e0 != 10) goto LAB_001be11f;
    uStack_7e0 = 1;
    if (sStack_750.ncalls != 1) goto LAB_001be12e;
    uStack_7e0 = 1;
    if (sStack_6c8.ncalls != 1) goto LAB_001be13d;
    start_timer(puVar5,0x11,&tStack_7d8);
    start_watcher(puVar5,0x11,&sStack_750,1);
    start_watcher(puVar5,0x11,&sStack_6c8,1);
    sStack_750.stop_or_close = CLOSE;
    sStack_6c8.stop_or_close = CLOSE;
    start_watcher(puVar5,0x11,&sStack_640,0);
    uv_close(&sStack_640.handle,0);
    iVar4 = uv_run(puVar5,0);
    uStack_7e0 = (ulong)iVar4;
    if (uStack_7e0 != 0) goto LAB_001be14c;
    uStack_7e0 = (ulong)tStack_7d8.ncalls;
    if (uStack_7e0 != 10) goto LAB_001be15b;
    uStack_7e0 = 1;
    if (sStack_750.ncalls != 1) goto LAB_001be16a;
    uStack_7e0 = 1;
    if (sStack_6c8.ncalls != 1) goto LAB_001be179;
    uStack_7e0 = (ulong)sStack_640.ncalls;
    if (uStack_7e0 != 0) goto LAB_001be188;
    start_timer(puVar5,0x11,&tStack_7d8);
    start_watcher(puVar5,0x11,&sStack_750,0);
    start_watcher(puVar5,0x11,&sStack_6c8,0);
    sStack_750.stop_or_close = CLOSE;
    sStack_6c8.stop_or_close = CLOSE;
    start_watcher(puVar5,0x11,&sStack_640,1);
    uv_close(&sStack_640.handle,0);
    iVar4 = uv_run(puVar5,0);
    uStack_7e0 = (ulong)iVar4;
    if (uStack_7e0 != 0) goto LAB_001be197;
    uStack_7e0 = (ulong)tStack_7d8.ncalls;
    if (uStack_7e0 != 10) goto LAB_001be1a6;
    uStack_7e0 = (ulong)sStack_750.ncalls;
    if (uStack_7e0 != 10) goto LAB_001be1b5;
    uStack_7e0 = (ulong)sStack_6c8.ncalls;
    if (uStack_7e0 != 10) goto LAB_001be1c4;
    uStack_7e0 = (ulong)sStack_640.ncalls;
    if (uStack_7e0 != 0) goto LAB_001be1d3;
    start_timer(puVar5,0x11,&tStack_7d8);
    start_watcher(puVar5,0x11,&sStack_750,0);
    start_watcher(puVar5,0x11,&sStack_6c8,0);
    start_watcher(puVar5,0x11,&sStack_640,1);
    start_watcher(puVar5,0x11,&sStack_5b8,1);
    sStack_640.stop_or_close = CLOSE;
    sStack_5b8.stop_or_close = CLOSE;
    uv_close(&sStack_750.handle,0);
    uv_close(&sStack_6c8.handle,0);
    iVar4 = uv_run(puVar5,0);
    uStack_7e0 = (ulong)iVar4;
    if (uStack_7e0 != 0) goto LAB_001be1e2;
    uStack_7e0 = (ulong)tStack_7d8.ncalls;
    if (uStack_7e0 != 10) goto LAB_001be1f1;
    uStack_7e0 = (ulong)sStack_750.ncalls;
    if (uStack_7e0 != 0) goto LAB_001be200;
    uStack_7e0 = (ulong)sStack_6c8.ncalls;
    if (uStack_7e0 != 0) goto LAB_001be20f;
    uStack_7e0 = 1;
    if (sStack_640.ncalls != 1) goto LAB_001be21e;
    uStack_7e0 = 1;
    start_timer(puVar5,0x11,&tStack_7d8);
    start_watcher(puVar5,0x11,&sStack_750,0);
    start_watcher(puVar5,0x11,&sStack_6c8,1);
    start_watcher(puVar5,0x11,&sStack_640,0);
    start_watcher(puVar5,0x11,&sStack_5b8,0);
    sStack_5b8.stop_or_close = CLOSE;
    uv_close(&sStack_750.handle,0);
    uv_close(&sStack_640.handle,0);
    iVar4 = uv_run(puVar5,0);
    uStack_7e0 = (ulong)iVar4;
    if (uStack_7e0 != 0) goto LAB_001be23c;
    uStack_7e0 = (ulong)tStack_7d8.ncalls;
    if (uStack_7e0 != 10) goto LAB_001be24b;
    uStack_7e0 = (ulong)sStack_750.ncalls;
    if (uStack_7e0 != 0) goto LAB_001be25a;
    uStack_7e0 = 1;
    if (sStack_6c8.ncalls != 1) goto LAB_001be269;
    uStack_7e0 = (ulong)sStack_640.ncalls;
    if (uStack_7e0 != 0) goto LAB_001be278;
    uStack_7e0 = (ulong)sStack_5b8.ncalls;
    if (uStack_7e0 == 10) {
      uv_walk(puVar5,close_walk_cb,0);
      uv_run(puVar5,0);
      uStack_7e0 = 0;
      iVar4 = uv_loop_close(puVar5);
      if (uStack_7e0 == (long)iVar4) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001be296;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001be11f:
    run_test_we_get_signals_mixed_cold_2();
LAB_001be12e:
    run_test_we_get_signals_mixed_cold_3();
LAB_001be13d:
    run_test_we_get_signals_mixed_cold_4();
LAB_001be14c:
    run_test_we_get_signals_mixed_cold_5();
LAB_001be15b:
    run_test_we_get_signals_mixed_cold_6();
LAB_001be16a:
    run_test_we_get_signals_mixed_cold_7();
LAB_001be179:
    run_test_we_get_signals_mixed_cold_8();
LAB_001be188:
    run_test_we_get_signals_mixed_cold_9();
LAB_001be197:
    run_test_we_get_signals_mixed_cold_10();
LAB_001be1a6:
    run_test_we_get_signals_mixed_cold_11();
LAB_001be1b5:
    run_test_we_get_signals_mixed_cold_12();
LAB_001be1c4:
    run_test_we_get_signals_mixed_cold_13();
LAB_001be1d3:
    run_test_we_get_signals_mixed_cold_14();
LAB_001be1e2:
    run_test_we_get_signals_mixed_cold_15();
LAB_001be1f1:
    run_test_we_get_signals_mixed_cold_16();
LAB_001be200:
    run_test_we_get_signals_mixed_cold_17();
LAB_001be20f:
    run_test_we_get_signals_mixed_cold_18();
LAB_001be21e:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001be23c:
    run_test_we_get_signals_mixed_cold_21();
LAB_001be24b:
    run_test_we_get_signals_mixed_cold_22();
LAB_001be25a:
    run_test_we_get_signals_mixed_cold_23();
LAB_001be269:
    run_test_we_get_signals_mixed_cold_24();
LAB_001be278:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001be296:
  puVar8 = &uStack_7e0;
  run_test_we_get_signals_mixed_cold_27();
  iVar4 = uv_is_closing();
  if (iVar4 != 0) {
    return;
  }
  uv_close(puVar8,0);
  return;
LAB_001bd743:
  ptStack_3b0 = (timer_ctx *)0x1bd750;
  run_test_we_get_signals_cold_3();
LAB_001bd750:
  ptStack_3b0 = (timer_ctx *)0x1bd75d;
  run_test_we_get_signals_cold_1();
  goto LAB_001bd75d;
}

Assistant:

static void start_watcher(uv_loop_t* loop,
                          int signum,
                          struct signal_ctx* ctx,
                          int one_shot) {
  ctx->ncalls = 0;
  ctx->signum = signum;
  ctx->stop_or_close = CLOSE;
  ctx->one_shot = one_shot;
  ASSERT_OK(uv_signal_init(loop, &ctx->handle));
  if (one_shot)
    ASSERT_OK(uv_signal_start_oneshot(&ctx->handle, signal_cb_one_shot, signum));
  else
    ASSERT_OK(uv_signal_start(&ctx->handle, signal_cb, signum));
}